

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O2

Rwt_Node_t *
Rwt_ManAddNode(Rwt_Man_t *p,Rwt_Node_t *p0,Rwt_Node_t *p1,int fExor,int Level,int Volume)

{
  Rwt_Node_t *pNode;
  uint uVar1;
  uint uVar2;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar2 = *(uint *)&p0->field_0x8;
    }
    else {
      uVar2 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 8);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar1 = *(uint *)&p1->field_0x8;
    }
    else {
      uVar1 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 8);
    }
    uVar1 = uVar1 & uVar2;
  }
  else {
    uVar1 = *(uint *)&p1->field_0x8 ^ *(uint *)&p0->field_0x8;
  }
  uVar2 = uVar1 & 0xffff;
  pNode = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pNode->Id = p->vForest->nSize;
  pNode->TravId = 0;
  *(uint *)&pNode->field_0x8 =
       fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18 | uVar2;
  pNode->p0 = p0;
  pNode->p1 = p1;
  pNode->pNext = (Rwt_Node_t *)0x0;
  Vec_PtrPush(p->vForest,pNode);
  if (p->puCanons[uVar2] == (unsigned_short)uVar1) {
    p->nAdded = p->nAdded + 1;
    if (p->pTable[uVar2] == (Rwt_Node_t *)0x0) {
      p->nClasses = p->nClasses + 1;
    }
    Rwt_ListAddToTail(p->pTable,pNode);
  }
  return pNode;
}

Assistant:

Rwt_Node_t * Rwt_ManAddNode( Rwt_Man_t * p, Rwt_Node_t * p0, Rwt_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwt_Node_t * pNew;
    unsigned uTruth;
    // compute truth table, leve, volume
    p->nConsidered++;
    if ( fExor )
        uTruth = (p0->uTruth ^ p1->uTruth);
    else
        uTruth = (Rwt_IsComplement(p0)? ~Rwt_Regular(p0)->uTruth : Rwt_Regular(p0)->uTruth) &
                 (Rwt_IsComplement(p1)? ~Rwt_Regular(p1)->uTruth : Rwt_Regular(p1)->uTruth) & 0xFFFF;
    // create the new node
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    // do not add if the node is not essential
    if ( uTruth != p->puCanons[uTruth] )
        return pNew;

    // add to the list
    p->nAdded++;
    if ( p->pTable[uTruth] == NULL )
        p->nClasses++;
    Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}